

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dchCnf.c
# Opt level: O0

void Dch_ObjAddToFrontier(Dch_Man_t *p,Aig_Obj_t *pObj,Vec_Ptr_t *vFrontier)

{
  int iVar1;
  Vec_Ptr_t *vFrontier_local;
  Aig_Obj_t *pObj_local;
  Dch_Man_t *p_local;
  
  iVar1 = Aig_IsComplement(pObj);
  if (iVar1 != 0) {
    __assert_fail("!Aig_IsComplement(pObj)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/dch/dchCnf.c"
                  ,0x108,"void Dch_ObjAddToFrontier(Dch_Man_t *, Aig_Obj_t *, Vec_Ptr_t *)");
  }
  iVar1 = Dch_ObjSatNum(p,pObj);
  if (iVar1 == 0) {
    iVar1 = Dch_ObjSatNum(p,pObj);
    if (iVar1 != 0) {
      __assert_fail("Dch_ObjSatNum(p,pObj) == 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/dch/dchCnf.c"
                    ,0x10b,"void Dch_ObjAddToFrontier(Dch_Man_t *, Aig_Obj_t *, Vec_Ptr_t *)");
    }
    iVar1 = Aig_ObjIsConst1(pObj);
    if (iVar1 == 0) {
      Vec_PtrPush(p->vUsedNodes,pObj);
      iVar1 = p->nSatVars;
      p->nSatVars = iVar1 + 1;
      Dch_ObjSetSatNum(p,pObj,iVar1);
      iVar1 = Aig_ObjIsNode(pObj);
      if (iVar1 != 0) {
        Vec_PtrPush(vFrontier,pObj);
      }
    }
  }
  return;
}

Assistant:

void Dch_ObjAddToFrontier( Dch_Man_t * p, Aig_Obj_t * pObj, Vec_Ptr_t * vFrontier )
{
    assert( !Aig_IsComplement(pObj) );
    if ( Dch_ObjSatNum(p,pObj) )
        return;
    assert( Dch_ObjSatNum(p,pObj) == 0 );
    if ( Aig_ObjIsConst1(pObj) )
        return;
    Vec_PtrPush( p->vUsedNodes, pObj );
    Dch_ObjSetSatNum( p, pObj, p->nSatVars++ );
    if ( Aig_ObjIsNode(pObj) )
        Vec_PtrPush( vFrontier, pObj );
}